

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.hpp
# Opt level: O0

bool __thiscall
vk::ValidateQueryBits::
validateInitComplete<vk::VkPhysicalDevice_s*,vk::InstanceInterface,vk::VkPhysicalDeviceProperties>
          (ValidateQueryBits *this,VkPhysicalDevice_s *context,
          offset_in_InstanceInterface_to_subr Function,InstanceInterface *interface,
          QueryMemberTableEntry *queryMemberTableEntry)

{
  int iVar1;
  long *plVar2;
  VkPhysicalDevice_s *local_700;
  VkPhysicalDevice_s *local_6e8;
  undefined1 local_6c8 [8];
  VkPhysicalDeviceProperties vec [2];
  QueryMemberTableEntry *local_50;
  QueryMemberTableEntry *iterator;
  QueryMemberTableEntry *queryMemberTableEntry_local;
  InstanceInterface *interface_local;
  offset_in_InstanceInterface_to_subr Function_local;
  VkPhysicalDevice_s *context_local;
  
  ::deMemset(local_6c8,0,0x338);
  ::deMemset(&vec[0].sparseProperties.residencyNonResidentStrict,0xff,0x338);
  plVar2 = (long *)((long)&interface->_vptr_InstanceInterface + Function);
  local_6e8 = context;
  if (((ulong)context & 1) != 0) {
    local_6e8 = *(VkPhysicalDevice_s **)(context + *plVar2 + -1);
  }
  (*(code *)local_6e8)(plVar2,this,local_6c8);
  plVar2 = (long *)((long)&interface->_vptr_InstanceInterface + Function);
  local_700 = context;
  if (((ulong)context & 1) != 0) {
    local_700 = *(VkPhysicalDevice_s **)(context + *plVar2 + -1);
  }
  (*(code *)local_700)(plVar2,this,&vec[0].sparseProperties.residencyNonResidentStrict);
  local_50 = queryMemberTableEntry;
  while( true ) {
    if (local_50->size == 0) {
      return true;
    }
    iVar1 = deMemCmp(local_6c8 + local_50->offset,
                     (void *)((long)&vec[0].sparseProperties.residencyNonResidentStrict +
                             local_50->offset),local_50->size);
    if (iVar1 != 0) break;
    local_50 = local_50 + 1;
  }
  return false;
}

Assistant:

bool validateInitComplete(Context context, void (Interface::*Function)(Context, Type*)const, const Interface& interface, const QueryMemberTableEntry* queryMemberTableEntry)
{
	const QueryMemberTableEntry	*iterator;
	Type vec[2];
	deMemset(&vec[0], 0x00, sizeof(Type));
	deMemset(&vec[1], 0xFF, sizeof(Type));

	(interface.*Function)(context, &vec[0]);
	(interface.*Function)(context, &vec[1]);

	for (iterator = queryMemberTableEntry; iterator->size != 0; iterator++)
	{
		if (deMemCmp(((deUint8*)(&vec[0]))+iterator->offset, ((deUint8*)(&vec[1]))+iterator->offset, iterator->size) != 0)
			return false;
	}

	return true;
}